

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void lj_record_ret(jit_State *J,BCReg rbase,ptrdiff_t gotresults)

{
  byte bVar1;
  code *pcVar2;
  IRIns *pIVar3;
  TValue *pTVar4;
  TValue TVar5;
  TraceError e;
  int iVar6;
  TRef TVar7;
  TRef TVar8;
  uint uVar9;
  TraceNo lnk;
  long lVar10;
  IRRef1 *pIVar11;
  TValue *pTVar12;
  TraceLink linktype;
  long lVar13;
  int iVar14;
  int iVar15;
  TRef *pTVar16;
  TValue TVar17;
  IRRef1 *pIVar18;
  ulong uVar19;
  IRIns o;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  
  uVar22 = (ulong)rbase;
  pTVar12 = J->L->base;
  uVar19 = (ulong)rbase;
  lVar20 = 0;
  if (0 < gotresults) {
    lVar20 = gotresults;
  }
  while (bVar23 = lVar20 != 0, lVar20 = lVar20 + -1, bVar23) {
    if (J->base[uVar19] == 0) {
      sload(J,(int32_t)uVar19);
    }
    uVar19 = uVar19 + 1;
  }
  pTVar12 = pTVar12 + -1;
  iVar6 = -(int)gotresults;
  while( true ) {
    uVar19 = pTVar12->u64;
    iVar15 = J->framedepth;
    uVar21 = (uint)uVar22;
    if ((~(uint)uVar19 & 6) != 0) break;
    J->framedepth = iVar15 + -1;
    if (iVar15 < 2) goto LAB_0012bb62;
    gotresults = gotresults + 1;
    iVar15 = (int)(uVar19 >> 3);
    J->baseslot = J->baseslot - iVar15;
    pTVar16 = (TRef *)((long)J->base - (uVar19 >> 1 & 0x3fffffffc));
    J->base = pTVar16;
    uVar22 = (ulong)((uVar21 + iVar15) - 1);
    pTVar16[uVar22] = 0x2007ffd;
    pTVar12 = (TValue *)((long)pTVar12 - (pTVar12->u64 & 0xfffffffffffffff8));
    J->needsnap = '\x01';
    iVar6 = iVar6 + -1;
  }
  if ((((iVar15 == 0) && (J->pt != (GCproto *)0x0)) && (0xfffffffb < (byte)*J->pc - 0x4d)) &&
     (((uVar19 & 3) != 0 ||
      (((J->parent == 0 && (J->exitno == 0)) && ((byte)(J->cur).startins - 0x4d < 0xfffffffc)))))) {
    for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
      J->base[uVar19] = 0;
    }
    J->maxslot = uVar21 - iVar6;
    linktype = LJ_TRLINK_RETURN;
    lnk = 0;
LAB_0012ba3a:
    lj_record_stop(J,linktype,lnk);
    return;
  }
  if (((uint)uVar19 & 7) == 3) {
    J->framedepth = iVar15 + -1;
    if (0 < iVar15) {
      iVar14 = (int)(uVar19 >> 3);
      J->baseslot = J->baseslot - iVar14;
      J->base = (TRef *)((long)J->base - (uVar19 >> 1 & 0x3fffffffc));
      uVar21 = uVar21 + iVar14;
      uVar19 = *(ulong *)((long)pTVar12 - (pTVar12->u64 & 0xfffffffffffffff8));
      pTVar12 = (TValue *)((long)pTVar12 - (pTVar12->u64 & 0xfffffffffffffff8));
      iVar15 = iVar15 + -1;
      goto LAB_0012b6c1;
    }
  }
  else {
LAB_0012b6c1:
    if ((uVar19 & 3) == 0) {
      uVar9 = *(uint *)(uVar19 - 4);
      lVar20 = (ulong)(uVar9 >> 0x18) - 1;
      if (uVar9 < 0x1000000) {
        lVar20 = gotresults;
      }
      uVar9 = uVar9 >> 8 & 0xff;
      iVar14 = uVar9 + 2;
      lVar13 = *(long *)((*(ulong *)((long)pTVar12 + (-8 - (ulong)(uint)(iVar14 * 8))) &
                         0x7fffffffffff) + 0x20);
      if ((*(byte *)(lVar13 + -0x2b) & 8) != 0) {
        e = LJ_TRERR_CJITOFF;
        goto LAB_0012bb64;
      }
      o = (IRIns)(lVar13 + -0x68);
      if (((iVar15 == 0) && (J->pt != (GCproto *)0x0)) && (pTVar12 == J->L->base + -1)) {
        pIVar11 = J->chain + 0x18;
        while( true ) {
          uVar19 = (ulong)*pIVar11;
          if (uVar19 == 0) break;
          pIVar3 = (J->cur).ir;
          if (o == pIVar3[uVar19 + 1]) {
            iVar15 = 0;
            for (pIVar18 = J->chain + 0xb; (ulong)*pIVar18 != 0;
                pIVar18 = &pIVar3[*pIVar18].field_0.prev) {
              iVar15 = iVar15 + (uint)(pIVar3[*pIVar18].field_0.op1 == *pIVar11);
            }
            if (iVar15 != 0) {
              if (J->pc != J->startpc) {
                e = LJ_TRERR_DOWNREC;
                goto LAB_0012bb64;
              }
              if (J->param[0xc] < iVar15 + J->tailcalled) {
                J->maxslot = uVar21 - iVar6;
                lj_snap_purge(J);
                lnk = (TraceNo)(J->cur).traceno;
                linktype = LJ_TRLINK_DOWNREC;
                goto LAB_0012ba3a;
              }
            }
          }
          pIVar11 = &(&pIVar3->field_0)[uVar19].prev;
        }
        lj_snap_add(J);
      }
      lVar10 = 0;
      lVar13 = 0;
      if (0 < lVar20) {
        lVar13 = lVar20;
      }
      for (; lVar13 != lVar10; lVar10 = lVar10 + 1) {
        TVar8 = 0x7fff;
        if (lVar10 < gotresults) {
          TVar8 = J->base[(ulong)uVar21 + lVar10];
        }
        J->base[lVar10 + -2] = TVar8;
      }
      J->maxslot = uVar9 + (int)lVar20;
      if (0 < J->framedepth) {
        J->framedepth = J->framedepth + -1;
        J->baseslot = J->baseslot - iVar14;
        J->base = J->base + (-2 - (ulong)uVar9);
        return;
      }
      if (((J->parent == 0) && (J->exitno == 0)) && ((byte)(J->cur).startins - 0x4d < 0xfffffffc)) {
        e = LJ_TRERR_LLEAVE;
        goto LAB_0012bb64;
      }
      if (J->needsnap == '\0') {
        TVar8 = lj_ir_kgc(J,(GCobj *)o,IRT_PROTO);
        TVar7 = lj_ir_kptr_(J,IR_KPTR,(void *)*pTVar12);
        (J->fold).ins.field_0.ot = 0xb89;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        lj_opt_fold(J);
        J->retdepth = J->retdepth + 1;
        J->needsnap = '\x01';
        memmove(J->base + uVar9,J->base + -2,lVar20 << 2);
        memset(J->base + -2,0,(ulong)(uint)(iVar14 * 4));
        return;
      }
    }
    else if (((uint)uVar19 & 7) == 2) {
      pcVar2 = (code *)pTVar12[-3].u64;
      J->framedepth = iVar15 + -2;
      if (1 < iVar15) {
        iVar6 = (int)(uVar19 >> 3);
        J->baseslot = J->baseslot - iVar6;
        uVar19 = uVar19 >> 3 & 0xffffffff;
        pTVar16 = J->base + -uVar19;
        J->base = pTVar16;
        uVar9 = iVar6 - 4;
        J->maxslot = uVar9;
        if (pcVar2 == lj_cont_ra) {
          bVar1 = *(byte *)(pTVar12[-2].u64 - 3);
          if (gotresults == 0) {
            TVar8 = 0x7fff;
          }
          else {
            TVar8 = pTVar16[uVar21 + iVar6];
          }
          pTVar16[bVar1] = TVar8;
          if ((uint)bVar1 < J->maxslot) {
            return;
          }
          J->maxslot = bVar1 + 1;
          return;
        }
        if (pcVar2 != lj_cont_cat) {
          return;
        }
        bVar1 = *(byte *)(pTVar12[-2].u64 - 1);
        if (gotresults == 0) {
          TVar8 = 0x7fff;
        }
        else {
          TVar8 = pTVar16[iVar6 + uVar21];
        }
        if (bVar1 == uVar9) {
LAB_0012baf5:
          if (TVar8 != 0) {
            bVar1 = *(byte *)(pTVar12[-2].u64 - 3);
            J->base[bVar1] = TVar8;
            if (J->maxslot <= (uint)bVar1) {
              J->maxslot = bVar1 + 1;
            }
          }
          return;
        }
        if (J->postproc == LJ_POST_NONE) {
          pTVar4 = J->L->base;
          pTVar16[uVar9] = TVar8;
          TVar5 = pTVar4[-4];
          if (gotresults == 0) {
            TVar17.u64 = 0xffffffffffffffff;
          }
          else {
            TVar17 = pTVar4[uVar21];
          }
          pTVar4[-4] = TVar17;
          J->L->base = pTVar4 + -uVar19;
          TVar8 = rec_cat(J,(uint)bVar1,uVar9);
          pTVar4 = J->L->base + uVar19;
          J->L->base = pTVar4;
          pTVar4[-4] = TVar5;
          goto LAB_0012baf5;
        }
      }
    }
  }
LAB_0012bb62:
  e = LJ_TRERR_NYIRETL;
LAB_0012bb64:
  lj_trace_err(J,e);
}

Assistant:

void lj_record_ret(jit_State *J, BCReg rbase, ptrdiff_t gotresults)
{
  TValue *frame = J->L->base - 1;
  ptrdiff_t i;
  for (i = 0; i < gotresults; i++)
    (void)getslot(J, rbase+i);  /* Ensure all results have a reference. */
  while (frame_ispcall(frame)) {  /* Immediately resolve pcall() returns. */
    BCReg cbase = (BCReg)frame_delta(frame);
    if (--J->framedepth <= 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    lj_assertJ(J->baseslot > 1+LJ_FR2, "bad baseslot for return");
    gotresults++;
    rbase += cbase;
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    J->base[--rbase] = TREF_TRUE;  /* Prepend true to results. */
    frame = frame_prevd(frame);
    J->needsnap = 1;  /* Stop catching on-trace errors. */
  }
  /* Return to lower frame via interpreter for unhandled cases. */
  if (J->framedepth == 0 && J->pt && bc_isret(bc_op(*J->pc)) &&
       (!frame_islua(frame) ||
	(J->parent == 0 && J->exitno == 0 &&
	 !bc_isret(bc_op(J->cur.startins))))) {
    /* NYI: specialize to frame type and return directly, not via RET*. */
    for (i = 0; i < (ptrdiff_t)rbase; i++)
      J->base[i] = 0;  /* Purge dead slots. */
    J->maxslot = rbase + (BCReg)gotresults;
    lj_record_stop(J, LJ_TRLINK_RETURN, 0);  /* Return to interpreter. */
    return;
  }
  if (frame_isvarg(frame)) {
    BCReg cbase = (BCReg)frame_delta(frame);
    if (--J->framedepth < 0)  /* NYI: return of vararg func to lower frame. */
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    lj_assertJ(J->baseslot > 1+LJ_FR2, "bad baseslot for return");
    rbase += cbase;
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    frame = frame_prevd(frame);
  }
  if (frame_islua(frame)) {  /* Return to Lua frame. */
    BCIns callins = *(frame_pc(frame)-1);
    ptrdiff_t nresults = bc_b(callins) ? (ptrdiff_t)bc_b(callins)-1 :gotresults;
    BCReg cbase = bc_a(callins);
    GCproto *pt = funcproto(frame_func(frame - (cbase+1+LJ_FR2)));
    if ((pt->flags & PROTO_NOJIT))
      lj_trace_err(J, LJ_TRERR_CJITOFF);
    if (J->framedepth == 0 && J->pt && frame == J->L->base - 1) {
      if (check_downrec_unroll(J, pt)) {
	J->maxslot = (BCReg)(rbase + gotresults);
	lj_snap_purge(J);
	lj_record_stop(J, LJ_TRLINK_DOWNREC, J->cur.traceno);  /* Down-rec. */
	return;
      }
      lj_snap_add(J);
    }
    for (i = 0; i < nresults; i++)  /* Adjust results. */
      J->base[i-1-LJ_FR2] = i < gotresults ? J->base[rbase+i] : TREF_NIL;
    J->maxslot = cbase+(BCReg)nresults;
    if (J->framedepth > 0) {  /* Return to a frame that is part of the trace. */
      J->framedepth--;
      lj_assertJ(J->baseslot > cbase+1+LJ_FR2, "bad baseslot for return");
      J->baseslot -= cbase+1+LJ_FR2;
      J->base -= cbase+1+LJ_FR2;
    } else if (J->parent == 0 && J->exitno == 0 &&
	       !bc_isret(bc_op(J->cur.startins))) {
      /* Return to lower frame would leave the loop in a root trace. */
      lj_trace_err(J, LJ_TRERR_LLEAVE);
    } else if (J->needsnap) {  /* Tailcalled to ff with side-effects. */
      lj_trace_err(J, LJ_TRERR_NYIRETL);  /* No way to insert snapshot here. */
    } else {  /* Return to lower frame. Guard for the target we return to. */
      TRef trpt = lj_ir_kgc(J, obj2gco(pt), IRT_PROTO);
      TRef trpc = lj_ir_kptr(J, (void *)frame_pc(frame));
      emitir(IRTG(IR_RETF, IRT_PGC), trpt, trpc);
      J->retdepth++;
      J->needsnap = 1;
      lj_assertJ(J->baseslot == 1+LJ_FR2, "bad baseslot for return");
      /* Shift result slots up and clear the slots of the new frame below. */
      memmove(J->base + cbase, J->base-1-LJ_FR2, sizeof(TRef)*nresults);
      memset(J->base-1-LJ_FR2, 0, sizeof(TRef)*(cbase+1+LJ_FR2));
    }
  } else if (frame_iscont(frame)) {  /* Return to continuation frame. */
    ASMFunction cont = frame_contf(frame);
    BCReg cbase = (BCReg)frame_delta(frame);
    if ((J->framedepth -= 2) < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    J->maxslot = cbase-(2<<LJ_FR2);
    if (cont == lj_cont_ra) {
      /* Copy result to destination slot. */
      BCReg dst = bc_a(*(frame_contpc(frame)-1));
      J->base[dst] = gotresults ? J->base[cbase+rbase] : TREF_NIL;
      if (dst >= J->maxslot) {
	J->maxslot = dst+1;
      }
    } else if (cont == lj_cont_nop) {
      /* Nothing to do here. */
    } else if (cont == lj_cont_cat) {
      BCReg bslot = bc_b(*(frame_contpc(frame)-1));
      TRef tr = gotresults ? J->base[cbase+rbase] : TREF_NIL;
      if (bslot != J->maxslot) {  /* Concatenate the remainder. */
	TValue *b = J->L->base, save;  /* Simulate lower frame and result. */
	/* Can't handle MM_concat + CALLT + fast func side-effects. */
	if (J->postproc != LJ_POST_NONE)
	  lj_trace_err(J, LJ_TRERR_NYIRETL);
	J->base[J->maxslot] = tr;
	copyTV(J->L, &save, b-(2<<LJ_FR2));
	if (gotresults)
	  copyTV(J->L, b-(2<<LJ_FR2), b+rbase);
	else
	  setnilV(b-(2<<LJ_FR2));
	J->L->base = b - cbase;
	tr = rec_cat(J, bslot, cbase-(2<<LJ_FR2));
	b = J->L->base + cbase;  /* Undo. */
	J->L->base = b;
	copyTV(J->L, b-(2<<LJ_FR2), &save);
      }
      if (tr) {  /* Store final result. */
	BCReg dst = bc_a(*(frame_contpc(frame)-1));
	J->base[dst] = tr;
	if (dst >= J->maxslot) {
	  J->maxslot = dst+1;
	}
      }  /* Otherwise continue with another __concat call. */
    } else {
      /* Result type already specialized. */
      lj_assertJ(cont == lj_cont_condf || cont == lj_cont_condt,
		 "bad continuation type");
    }
  } else {
    lj_trace_err(J, LJ_TRERR_NYIRETL);  /* NYI: handle return to C frame. */
  }
  lj_assertJ(J->baseslot >= 1+LJ_FR2, "bad baseslot for return");
}